

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

int htmlElementAllowedHere(htmlElemDesc *parent,xmlChar *elt)

{
  int iVar1;
  char **local_28;
  char **p;
  xmlChar *elt_local;
  htmlElemDesc *parent_local;
  
  if (((elt != (xmlChar *)0x0) && (parent != (htmlElemDesc *)0x0)) &&
     (parent->subelts != (char **)0x0)) {
    for (local_28 = parent->subelts; *local_28 != (char *)0x0; local_28 = local_28 + 1) {
      iVar1 = xmlStrcmp((xmlChar *)*local_28,elt);
      if (iVar1 == 0) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int
htmlElementAllowedHere(const htmlElemDesc* parent, const xmlChar* elt) {
  const char** p ;

  if ( ! elt || ! parent || ! parent->subelts )
	return 0 ;

  for ( p = parent->subelts; *p; ++p )
    if ( !xmlStrcmp((const xmlChar *)*p, elt) )
      return 1 ;

  return 0 ;
}